

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

void bcf_sr_regions_destroy(bcf_sr_regions_t *reg)

{
  int local_14;
  int i;
  bcf_sr_regions_t *reg_local;
  
  free(reg->fname);
  if (reg->itr != (hts_itr_t *)0x0) {
    hts_itr_destroy(reg->itr);
  }
  if (reg->tbx != (tbx_t *)0x0) {
    tbx_destroy(reg->tbx);
  }
  if (reg->file != (htsFile *)0x0) {
    hts_close(reg->file);
  }
  if (reg->als != (char **)0x0) {
    free(reg->als);
  }
  if ((reg->als_str).s != (char *)0x0) {
    free((reg->als_str).s);
  }
  free((reg->line).s);
  if (reg->regs != (_region_t *)0x0) {
    for (local_14 = 0; local_14 < reg->nseqs; local_14 = local_14 + 1) {
      free(reg->seq_names[local_14]);
      free(reg->regs[local_14].regs);
    }
  }
  free(reg->regs);
  free(reg->seq_names);
  khash_str2int_destroy(reg->seq_hash);
  free(reg);
  return;
}

Assistant:

void bcf_sr_regions_destroy(bcf_sr_regions_t *reg)
{
    int i;
    free(reg->fname);
    if ( reg->itr ) tbx_itr_destroy(reg->itr);
    if ( reg->tbx ) tbx_destroy(reg->tbx);
    if ( reg->file ) hts_close(reg->file);
    if ( reg->als ) free(reg->als);
    if ( reg->als_str.s ) free(reg->als_str.s);
    free(reg->line.s);
    if ( reg->regs )
    {
         // free only in-memory names, tbx names are const
        for (i=0; i<reg->nseqs; i++)
        {
            free(reg->seq_names[i]);
            free(reg->regs[i].regs);
        }
    }
    free(reg->regs);
    free(reg->seq_names);
    khash_str2int_destroy(reg->seq_hash);
    free(reg);
}